

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O0

void __thiscall
dg::pta::LLVMPointerGraphBuilder::PSNodesBlock::append(PSNodesBlock *this,PSNodesSeq *s)

{
  value_type *in_RDI;
  vector<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq_*,_std::allocator<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq_*>_>
  *unaff_retaddr;
  
  std::
  vector<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq_*,_std::allocator<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq_*>_>
  ::push_back(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void append(PSNodesSeq *s) { _nodes.push_back(s); }